

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.hpp
# Opt level: O3

void diy::Serialization<std::vector<diy::Bounds<double>,_std::allocator<diy::Bounds<double>_>_>_>::
     load(BinaryBuffer *bb,Vector *v)

{
  size_type __new_size;
  size_t s;
  size_type local_c8;
  Bounds<double> local_c0;
  
  (*bb->_vptr_BinaryBuffer[4])(bb,&local_c8,8);
  __new_size = local_c8;
  Bounds<double>::Bounds(&local_c0,0);
  std::vector<diy::Bounds<double>,_std::allocator<diy::Bounds<double>_>_>::resize
            (v,__new_size,&local_c0);
  local_c0.max.super_small_vector<double,_4UL,_0UL,_std::allocator<double>_>.m_end =
       local_c0.max.super_small_vector<double,_4UL,_0UL,_std::allocator<double>_>.m_begin;
  if (local_c0.max.super_small_vector<double,_4UL,_0UL,_std::allocator<double>_>.m_dynamic_data !=
      (pointer)0x0) {
    operator_delete(local_c0.max.super_small_vector<double,_4UL,_0UL,_std::allocator<double>_>.
                    m_dynamic_data,
                    local_c0.max.super_small_vector<double,_4UL,_0UL,_std::allocator<double>_>.
                    m_dynamic_capacity << 3);
  }
  local_c0.min.super_small_vector<double,_4UL,_0UL,_std::allocator<double>_>.m_end =
       local_c0.min.super_small_vector<double,_4UL,_0UL,_std::allocator<double>_>.m_begin;
  if (local_c0.min.super_small_vector<double,_4UL,_0UL,_std::allocator<double>_>.m_dynamic_data !=
      (pointer)0x0) {
    operator_delete(local_c0.min.super_small_vector<double,_4UL,_0UL,_std::allocator<double>_>.
                    m_dynamic_data,
                    local_c0.min.super_small_vector<double,_4UL,_0UL,_std::allocator<double>_>.
                    m_dynamic_capacity << 3);
  }
  if (local_c8 != 0) {
    load<diy::Bounds<double>>
              (bb,(v->super__Vector_base<diy::Bounds<double>,_std::allocator<diy::Bounds<double>_>_>
                  )._M_impl.super__Vector_impl_data._M_start,local_c8);
  }
  return;
}

Assistant:

static void         load(BinaryBuffer& bb, Vector& v)
    {
      size_t s;
      diy::load(bb, s);
      v.resize(s, U());
      if (s > 0)
        diy::load(bb, &v[0], s);
    }